

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O2

void __thiscall
cbtAxisSweep3Internal<unsigned_int>::sortMinUp
          (cbtAxisSweep3Internal<unsigned_int> *this,int axis,uint edge,cbtDispatcher *dispatcher,
          bool updateOverlaps)

{
  int *piVar1;
  int *piVar2;
  cbtOverlappingPairCallback *pcVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  long lVar6;
  uint axis0;
  Edge *pEVar7;
  long lVar8;
  Handle *handle1;
  Handle *pHandleB;
  Handle *pHandleA;
  
  lVar8 = (long)axis;
  pEVar7 = this->m_pEdges[lVar8] + edge;
  axis0 = 1 << (axis & 0x1fU) & 3;
  piVar1 = (int *)((long)(&this->m_pHandles[pEVar7->m_handle].super_cbtBroadphaseProxy.m_aabbMax + 1
                         ) + lVar8 * 4);
  for (; ((ulong)pEVar7[1].m_handle != 0 && (pEVar7[1].m_pos <= pEVar7->m_pos)); pEVar7 = pEVar7 + 1
      ) {
    pHandleB = this->m_pHandles + pEVar7[1].m_handle;
    lVar6 = 0x34;
    if (((pEVar7[1].m_pos & 1) != 0) && (lVar6 = 0x40, updateOverlaps)) {
      pHandleA = this->m_pHandles + pEVar7->m_handle;
      bVar5 = testOverlap2D(this,pHandleA,pHandleB,axis0,1 << axis0 & 3);
      lVar6 = 0x40;
      if (bVar5) {
        (*(this->m_pairCache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback[3])
                  (this->m_pairCache,pHandleA,pHandleB,dispatcher);
        lVar6 = 0x40;
        pcVar3 = this->m_userPairCallback;
        if (pcVar3 != (cbtOverlappingPairCallback *)0x0) {
          (*pcVar3->_vptr_cbtOverlappingPairCallback[3])(pcVar3,pHandleA,pHandleB,dispatcher);
          lVar6 = 0x40;
        }
      }
    }
    piVar2 = (int *)((long)(pHandleB->super_cbtBroadphaseProxy).m_aabbMin.m_floats +
                    lVar8 * 4 + lVar6 + -0x14);
    *piVar2 = *piVar2 + -1;
    *piVar1 = *piVar1 + 1;
    auVar4 = vpermilps_avx(*(undefined1 (*) [16])pEVar7,0x4e);
    *(undefined1 (*) [16])pEVar7 = auVar4;
  }
  return;
}

Assistant:

void cbtAxisSweep3Internal<BP_FP_INT_TYPE>::sortMinUp(int axis, BP_FP_INT_TYPE edge, cbtDispatcher* dispatcher, bool updateOverlaps)
{
	Edge* pEdge = m_pEdges[axis] + edge;
	Edge* pNext = pEdge + 1;
	Handle* pHandleEdge = getHandle(pEdge->m_handle);

	while (pNext->m_handle && (pEdge->m_pos >= pNext->m_pos))
	{
		Handle* pHandleNext = getHandle(pNext->m_handle);

		if (pNext->IsMax())
		{
			Handle* handle0 = getHandle(pEdge->m_handle);
			Handle* handle1 = getHandle(pNext->m_handle);
			const int axis1 = (1 << axis) & 3;
			const int axis2 = (1 << axis1) & 3;

			// if next edge is maximum remove any overlap between the two handles
			if (updateOverlaps
#ifdef USE_OVERLAP_TEST_ON_REMOVES
				&& testOverlap2D(handle0, handle1, axis1, axis2)
#endif  //USE_OVERLAP_TEST_ON_REMOVES
			)
			{
				m_pairCache->removeOverlappingPair(handle0, handle1, dispatcher);
				if (m_userPairCallback)
					m_userPairCallback->removeOverlappingPair(handle0, handle1, dispatcher);
			}

			// update edge reference in other handle
			pHandleNext->m_maxEdges[axis]--;
		}
		else
			pHandleNext->m_minEdges[axis]--;

		pHandleEdge->m_minEdges[axis]++;

		// swap the edges
		Edge swap = *pEdge;
		*pEdge = *pNext;
		*pNext = swap;

		// increment
		pEdge++;
		pNext++;
	}